

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompRelationalExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  bool bVar1;
  uint local_18;
  int op1;
  int strict;
  int inf;
  xmlXPathParserContextPtr ctxt_local;
  
  xmlXPathCompAdditiveExpr(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while( true ) {
      bVar1 = true;
      if (*ctxt->cur != '<') {
        bVar1 = *ctxt->cur == '>';
      }
      if (!bVar1) break;
      ch1 = ctxt->comp->last;
      op1 = (int)(*ctxt->cur == '<');
      local_18 = (uint)(ctxt->cur[1] != '=');
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      if ((local_18 == 0) && (*ctxt->cur != '\0')) {
        ctxt->cur = ctxt->cur + 1;
      }
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompAdditiveExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_CMP,op1,local_18,0,(void *)0x0,
                          (void *)0x0);
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompRelationalExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompAdditiveExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '<') || (CUR == '>')) {
	int inf, strict;
	int op1 = ctxt->comp->last;

        if (CUR == '<') inf = 1;
	else inf = 0;
	if (NXT(1) == '=') strict = 0;
	else strict = 1;
	NEXT;
	if (!strict) NEXT;
	SKIP_BLANKS;
        xmlXPathCompAdditiveExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_CMP, op1, ctxt->comp->last, inf, strict);
	SKIP_BLANKS;
    }
}